

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::identStmt(Parser *this)

{
  Type TVar1;
  Token TVar2;
  Lexer *pLVar3;
  Report *this_00;
  bool bVar4;
  LiteralType args;
  LiteralType args_1;
  SymbolTable *this_01;
  Parser *in_RSI;
  undefined1 auVar5 [8];
  undefined1 auVar6 [8];
  undefined1 local_130 [8];
  VariableSym *var;
  undefined1 local_120 [8];
  undefined1 local_118 [8];
  Symbol *callee;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f8;
  _Any_data _Stack_e8;
  __uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_> _Stack_d8;
  SymbolTable *local_d0;
  undefined1 local_c8 [8];
  list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> symbols;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  SourceLocation loc;
  
  SourceLocation::SourceLocation
            (&loc,&((in_RSI->lexer_)._M_t.
                    super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                    .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->location_);
  stringValue_abi_cxx11_(&name,in_RSI);
  nextToken(in_RSI);
  symbols.super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&symbols;
  symbols.super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>._M_impl.
  _M_node._M_size = 0;
  symbols.super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       symbols.super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  callee = SymbolTable::lookup(in_RSI->scopeStack_,&name,All,
                               (list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *)
                               symbols.
                               super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>
                               ._M_impl._M_node.super__List_node_base._M_next);
  if (callee == (Symbol *)0x0) {
    pLVar3 = (in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
    if (pLVar3->token_ == Semicolon) {
      this_01 = globalScope(in_RSI);
      std::make_unique<flow::lang::HandlerSym,std::__cxx11::string&,flow::SourceLocation&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (SourceLocation *)&name);
      local_118 = (undefined1  [8])local_108._0_8_;
      local_108._0_8_ = (long *)0x0;
      callee = SymbolTable::appendSymbol
                         (this_01,(unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
                                   *)local_118);
      if ((_Head_base<0UL,_flow::lang::Symbol_*,_false>)local_118 !=
          (_Head_base<0UL,_flow::lang::Symbol_*,_false>)0x0) {
        (**(code **)(*(long *)local_118 + 8))();
      }
      local_118 = (undefined1  [8])0x0;
      if ((long *)local_108._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
      std::__cxx11::list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>::push_back
                (&symbols,&callee);
      goto LAB_00124a54;
    }
    this_00 = in_RSI->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,"Unknown symbol \'{}\'.",(allocator<char> *)local_130);
    std::__cxx11::string::string((string *)&local_88,(string *)&name);
    diagnostics::Report::typeError<std::__cxx11::string>
              (this_00,&pLVar3->lastLocation_,(string *)local_108,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)local_108);
LAB_00124bc4:
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  }
  else {
LAB_00124a54:
    TVar1 = callee->type_;
    if (TVar1 - BuiltinFunction < 2) {
      callStmt((Parser *)local_108,
               (list<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_> *)in_RSI);
      if ((long *)local_108._0_8_ == (long *)0x0) goto LAB_00124bc4;
      std::
      make_unique<flow::lang::ExprStmt,std::unique_ptr<flow::lang::CallExpr,std::default_delete<flow::lang::CallExpr>>>
                ((unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> *)
                 local_130);
      auVar6 = local_130;
      if ((long *)local_108._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
    else if (TVar1 == Handler) {
      local_108._0_8_ = local_108._0_8_ & 0xffffffffffffff00;
      local_108._8_8_ =
           (__uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>)0x0;
      aStack_f8._M_allocated_capacity = 0;
      aStack_f8._8_8_ = 0;
      _Stack_e8._M_unused._M_object = (void *)0x0;
      _Stack_e8._8_8_ = 0;
      _Stack_d8._M_t.
      super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
      super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl =
           (tuple<flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)
           (_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)0x0;
      local_c8 = (undefined1  [8])callee;
      std::
      make_unique<flow::lang::CallExpr,flow::SourceLocation&,flow::lang::CallableSym*,flow::lang::ParamList>
                ((SourceLocation *)&var,(CallableSym **)&loc,(ParamList *)local_c8);
      std::
      make_unique<flow::lang::ExprStmt,std::unique_ptr<flow::lang::CallExpr,std::default_delete<flow::lang::CallExpr>>>
                ((unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> *)
                 local_130);
      auVar6 = local_130;
      local_130 = (undefined1  [8])0x0;
      if (var != (VariableSym *)0x0) {
        (*(var->super_Symbol).super_ASTNode._vptr_ASTNode[1])();
      }
      var = (VariableSym *)0x0;
      ParamList::~ParamList((ParamList *)local_108);
    }
    else {
      auVar6 = (undefined1  [8])(_Base_ptr)0x0;
      if (TVar1 == Variable) {
        bVar4 = consume(in_RSI,Assign);
        if ((!bVar4) ||
           (logicExpr((Parser *)local_130), auVar5 = local_130, local_130 == (undefined1  [8])0x0))
        goto LAB_00124bc4;
        var = (VariableSym *)callee;
        args = (**(code **)(*callee[1].super_ASTNode._vptr_ASTNode + 0x18))();
        args_1 = (**(code **)(*(long *)auVar5 + 0x18))(auVar5);
        if (args == args_1) {
          pLVar3 = (in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
          loc.end.offset = (pLVar3->lastLocation_).end.offset;
          loc.end.line = (pLVar3->lastLocation_).end.line;
          loc.end.column = (pLVar3->lastLocation_).end.column;
          std::
          make_unique<flow::lang::AssignStmt,flow::lang::VariableSym*&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                    ((VariableSym **)local_108,
                     (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&var,
                     (SourceLocation *)local_130);
          auVar5 = local_130;
          auVar6 = (undefined1  [8])local_108._0_8_;
          if (local_130 == (undefined1  [8])0x0) goto LAB_00124c38;
        }
        else {
          pLVar3 = (in_RSI->lexer_)._M_t.
                   super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                   .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
          local_d0 = (SymbolTable *)in_RSI->report_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_108,"Type mismatch in assignment. Expected <{}> but got <{}>.",
                     (allocator<char> *)local_c8);
          diagnostics::Report::typeError<flow::LiteralType,flow::LiteralType>
                    ((Report *)local_d0,&pLVar3->lastLocation_,(string *)local_108,args,args_1);
          std::__cxx11::string::~string((string *)local_108);
          *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
          auVar6 = (undefined1  [8])0x0;
        }
        (**(code **)(*(long *)auVar5 + 8))(auVar5);
        if (args != args_1) goto LAB_00124c78;
      }
    }
LAB_00124c38:
    TVar2 = ((in_RSI->lexer_)._M_t.
             super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
             super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl)->token_;
    if ((TVar2 == Unless) || (TVar2 == If)) {
      local_120 = auVar6;
      postscriptStmt(this,(unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                          in_RSI);
      if (local_120 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_120 + 8))();
      }
      local_120 = (undefined1  [8])0x0;
    }
    else {
      bVar4 = consume(in_RSI,Semicolon);
      if (!bVar4) {
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        goto LAB_00124c78;
      }
      *(undefined1 (*) [8])&(this->features_)._M_t._M_impl = auVar6;
    }
  }
  auVar6 = (undefined1  [8])0x0;
LAB_00124c78:
  std::__cxx11::_List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>::_M_clear
            (&symbols.super__List_base<flow::lang::Symbol_*,_std::allocator<flow::lang::Symbol_*>_>)
  ;
  if (auVar6 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)auVar6 + 8))(auVar6);
  }
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&loc);
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::identStmt() {
  // identStmt  ::= callStmt | assignStmt
  // callStmt   ::= NAME ['(' paramList ')' | paramList] (';' | LF)
  // assignStmt ::= NAME '=' expr [';' | LF]
  //
  // NAME may be a builtin-function, builtin-handler, handler-name, or variable.

  SourceLocation loc(location());
  std::string name = stringValue();
  nextToken();  // IDENT

  std::unique_ptr<Stmt> stmt;
  std::list<Symbol*> symbols;
  Symbol* callee = currentScope()->lookup(name, Lookup::All, &symbols);
  if (!callee) {
    // XXX assume that given symbol is a auto forward-declared handler that's
    // being defined later in the source.
    if (token() != Token::Semicolon) {
      report_.typeError(lastLocation(), "Unknown symbol '{}'.", name);
      return nullptr;
    }

    callee = (HandlerSym*)globalScope()->appendSymbol(
        std::make_unique<HandlerSym>(name, loc));
    symbols.push_back(callee);
  }

  switch (callee->type()) {
    case Symbol::Variable: {  // var '=' expr (';' | LF)
      if (!consume(Token::Assign)) return nullptr;

      std::unique_ptr<Expr> value = expr();
      if (!value) return nullptr;

      VariableSym* var = static_cast<VariableSym*>(callee);
      LiteralType leftType = var->initializer()->getType();
      LiteralType rightType = value->getType();
      if (leftType != rightType) {
        report_.typeError(
            lastLocation(),
            "Type mismatch in assignment. Expected <{}> but got <{}>.",
            leftType, rightType);
        return nullptr;
      }

      stmt = std::make_unique<AssignStmt>(var, std::move(value),
                                          loc.update(end()));
      break;
    }
    case Symbol::BuiltinFunction:
    case Symbol::BuiltinHandler: {
      auto call = callStmt(symbols);
      if (!call) {
        return nullptr;
      }
      stmt = std::make_unique<ExprStmt>(std::move(call));
      break;
    }
    case Symbol::Handler:
      stmt = std::make_unique<ExprStmt>(
          std::make_unique<CallExpr>(loc, (CallableSym*)callee, ParamList()));
      break;
    default:
      break;
  }

  // postscript statement handling
  if (testTokens(Token::If, Token::Unless))
      return postscriptStmt(std::move(stmt));

  if (!consume(Token::Semicolon))
    return nullptr;

  return stmt;
}